

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UriParse.c
# Opt level: O0

UriBool uriOnExitSegmentNzNcOrScheme2W
                  (UriParserStateW *state,wchar_t *first,UriMemoryManager *memory)

{
  UriBool UVar1;
  UriMemoryManager *memory_local;
  wchar_t *first_local;
  UriParserStateW *state_local;
  
  UVar1 = uriPushPathSegmentW(state,(state->uri->scheme).first,first,memory);
  if (UVar1 != 0) {
    (state->uri->scheme).first = (wchar_t *)0x0;
  }
  state_local._4_4_ = (uint)(UVar1 != 0);
  return state_local._4_4_;
}

Assistant:

static URI_INLINE UriBool URI_FUNC(OnExitSegmentNzNcOrScheme2)(
		URI_TYPE(ParserState) * state, const URI_CHAR * first,
		UriMemoryManager * memory) {
	if (!URI_FUNC(PushPathSegment)(state, state->uri->scheme.first, first, memory)) { /* SEGMENT BOTH */
		return URI_FALSE; /* Raises malloc error*/
	}
	state->uri->scheme.first = NULL; /* Not a scheme, reset */
	return URI_TRUE; /* Success */
}